

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Dynamic_Caster<std::runtime_error,_chaiscript::exception::eval_error>::cast
          (Dynamic_Caster<std::runtime_error,_chaiscript::exception::eval_error> *this,
          Boxed_Value *t_from)

{
  uint uVar1;
  element_type *peVar2;
  bool bVar3;
  Result_Type prVar4;
  reference_wrapper<chaiscript::exception::eval_error> obj;
  Result_Type prVar5;
  reference_wrapper<const_chaiscript::exception::eval_error> obj_00;
  bad_boxed_dynamic_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar7;
  Boxed_Value BVar8;
  undefined1 local_40 [32];
  Boxed_Value *local_20;
  
  local_40._0_8_ = &std::runtime_error::typeinfo;
  local_40._8_8_ = &std::runtime_error::typeinfo;
  local_40._16_4_ = 0;
  bVar3 = Type_Info::bare_equal
                    (&((t_from->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,(Type_Info *)local_40);
  if (!bVar3) {
    this_00 = (bad_boxed_dynamic_cast *)__cxa_allocate_exception(0x48);
    peVar2 = (t_from->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_40._0_8_ = local_40 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"Unknown dynamic_cast_conversion","");
    chaiscript::exception::bad_boxed_dynamic_cast::bad_boxed_dynamic_cast
              (this_00,&peVar2->m_type_info,
               (type_info *)&chaiscript::exception::eval_error::typeinfo,(string *)local_40);
    __cxa_throw(this_00,&chaiscript::exception::bad_boxed_dynamic_cast::typeinfo,
                chaiscript::exception::bad_boxed_cast::~bad_boxed_cast);
  }
  peVar2 = (t_from->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (peVar2->m_type_info).m_flags;
  if (peVar2->m_is_ref == false) {
    local_20 = t_from;
    if ((uVar1 & 1) == 0) {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)local_40);
      sVar7 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error>
                        ((Object_Data *)this,
                         (shared_ptr<chaiscript::exception::eval_error> *)local_40,false);
      _Var6 = sVar7.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    else {
      cast::anon_class_8_1_6c80e9d3::operator()((anon_class_8_1_6c80e9d3 *)local_40);
      sVar7 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error_const>
                        ((Object_Data *)this,
                         (shared_ptr<const_chaiscript::exception::eval_error> *)local_40,false);
      _Var6 = sVar7.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._8_8_);
      _Var6._M_pi = extraout_RDX;
    }
  }
  else if ((uVar1 & 1) == 0) {
    prVar4 = Cast_Helper_Inner<std::runtime_error_&>::cast(t_from,(Type_Conversions_State *)0x0);
    obj._M_data = (eval_error *)
                  __dynamic_cast(prVar4,&std::runtime_error::typeinfo,
                                 &chaiscript::exception::eval_error::typeinfo,0);
    if (obj._M_data == (eval_error *)0x0) {
LAB_00224140:
      __cxa_bad_cast();
    }
    sVar7 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error>
                      ((Object_Data *)this,obj,false);
    _Var6 = sVar7.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  else {
    prVar5 = Cast_Helper_Inner<const_std::runtime_error_&>::cast
                       (t_from,(Type_Conversions_State *)0x0);
    obj_00._M_data =
         (eval_error *)
         __dynamic_cast(prVar5,&std::runtime_error::typeinfo,
                        &chaiscript::exception::eval_error::typeinfo,0);
    if (obj_00._M_data == (eval_error *)0x0) goto LAB_00224140;
    sVar7 = Boxed_Value::Object_Data::get<chaiscript::exception::eval_error_const>
                      ((Object_Data *)this,obj_00,false);
    _Var6 = sVar7.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar8.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value cast(const Boxed_Value &t_from)
          {
            if (t_from.get_type_info().bare_equal(chaiscript::user_type<From>()))
            {
              if (t_from.is_pointer())
              {
                // Dynamic cast out the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<const To>{
                        if (auto data = std::dynamic_pointer_cast<const To>(detail::Cast_Helper<std::shared_ptr<const From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
                          throw std::bad_cast();
                        }
                      }()
                      );
                } else {
                  return Boxed_Value(
                      [&]()->std::shared_ptr<To>{
                        if (auto data = std::dynamic_pointer_cast<To>(detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr)))
                        {
                          return data;
                        } else {
#ifdef CHAISCRIPT_LIBCPP
                          /// \todo fix this someday after libc++ is fixed.
                          if (std::string(typeid(To).name()).find("Assignable_Proxy_Function") != std::string::npos) {
                            auto from = detail::Cast_Helper<std::shared_ptr<From> >::cast(t_from, nullptr);
                            if (std::string(typeid(*from).name()).find("Assignable_Proxy_Function_Impl") != std::string::npos) {
                              return std::static_pointer_cast<To>(from);
                            }
                          }
#endif
                          throw std::bad_cast();
                        }
                      }()
                      );
                }
              } else {
                // Pull the reference out of the contained boxed value, which we know is the type we want
                if (t_from.is_const())
                {
                  const From &d = detail::Cast_Helper<const From &>::cast(t_from, nullptr);
                  const To &data = dynamic_cast<const To &>(d);
                  return Boxed_Value(std::cref(data));
                } else {
                  From &d = detail::Cast_Helper<From &>::cast(t_from, nullptr);
                  To &data = dynamic_cast<To &>(d);
                  return Boxed_Value(std::ref(data));
                }
              }
            } else {
              throw chaiscript::exception::bad_boxed_dynamic_cast(t_from.get_type_info(), typeid(To), "Unknown dynamic_cast_conversion");
            }
          }